

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cc
# Opt level: O0

VariableStruct * __thiscall VariableStruct::OutputDef_abi_cxx11_(VariableStruct *this)

{
  long lVar1;
  string *in_RSI;
  string local_98 [36];
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [4];
  int loop;
  string local_50 [48];
  undefined4 local_20;
  undefined1 local_19;
  VARTYPE ActualType;
  VariableStruct *this_local;
  string *result;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  local_20 = *(undefined4 *)(in_RSI + 0x20);
  if (*(int *)(in_RSI + 0x24) == 3) {
    std::__cxx11::string::operator=((string *)this,"const ");
  }
  OutputVarType_abi_cxx11_((VARTYPE)local_50);
  std::__cxx11::string::operator+=((string *)this,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::operator+=((string *)this," ");
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    std::operator+(local_70,(char *)(in_RSI + 0x48));
    std::__cxx11::string::operator+=((string *)this,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    std::__cxx11::string::operator+=((string *)this,in_RSI);
  }
  else {
    std::__cxx11::string::operator+=((string *)this,in_RSI + 0x28);
  }
  if (*(int *)(in_RSI + 0x20) == 5) {
    std::__cxx11::string::operator+=((string *)this,"[]");
  }
  if (*(int *)(in_RSI + 0x24) == 1) {
    std::__cxx11::string::operator+=((string *)this,"[11]");
    for (local_74 = 2; local_74 <= *(int *)(in_RSI + 0x70); local_74 = local_74 + 1) {
      std::__cxx11::string::operator+=((string *)this,"[11]");
    }
  }
  else if (*(int *)(in_RSI + 0x24) == 2) {
    std::__cxx11::string::operator+=((string *)this,"()");
  }
  OutputVarInit_abi_cxx11_((int)local_98,*(int *)(in_RSI + 0x24));
  std::__cxx11::string::operator+=((string *)this,local_98);
  std::__cxx11::string::~string(local_98);
  *(undefined4 *)(in_RSI + 0x68) = 1;
  return this;
}

Assistant:

std::string VariableStruct::OutputDef(void)
{
	//
	// Local Variables
	//
	std::string result;
	VARTYPE ActualType = Type;

	//
	// Output This Variable
	//
	switch (Class)
	{
	case VARCLASS_CONST:
		result = "const ";
		break;
	}

	result += OutputVarType(ActualType);
	result += " ";

	//
	// Pick a good name
	//
	if (Prefix.length() != 0)
	{
		result += Prefix + ".";
	}

	//
	// Pick a good name
	//
	if (CName.length() != 0)
	{
		result += CName;
	}
	else
	{
		result += BasicName;
	}

	switch(Type)
	{
	case VARTYPE_FIXSTR:
		result += "[]";
		break;
	}

	//
	// Add brackets if this is an array definition
	//
	switch (Class)
	{
	case VARCLASS_ARRAY:
		//
		// Default array dimension under Basic is 0..10
		// for most Basic's I've seen.
		//
		result += "[11]";
		for (int loop = 2; loop <= ParCount; loop++)
		{
			result += "[11]";
		}
		break;

	case VARCLASS_FUNC:
		result += "()";
		break;
	}

	result += OutputVarInit(Class, Type);

	//
	// Flag this one as having been output.
	//
	Output = true;
	return result;
}